

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O1

void nn_xbus_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist_data *data;
  
  data = (nn_dist_data *)nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)&self[2].sock,(nn_fq_data *)(data + 1));
  nn_dist_rm((nn_dist *)(self + 1),data);
  nn_free(data);
  return;
}

Assistant:

void nn_xbus_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xbus *xbus;
    struct nn_xbus_data *data;

    xbus = nn_cont (self, struct nn_xbus, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xbus->inpipes, &data->initem);
    nn_dist_rm (&xbus->outpipes, &data->outitem);

    nn_free (data);
}